

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::ListBuilder::asReader(ListReader *__return_storage_ptr__,ListBuilder *this)

{
  ElementSize EVar1;
  StructPointerCount SVar2;
  BitsPerElementN<23> step;
  StructDataBitCount structDataSize;
  StructDataBitCount SVar3;
  Entry ptr;
  int iVar4;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa4 [12];
  ListReader *this_00;
  SegmentBuilder *segment;
  CapTableReader *capTable;
  ListElementCount elementCount;
  ListBuilder *this_local;
  
  segment = this->segment;
  capTable = &this->capTable->super_CapTableReader;
  elementCount = (ListElementCount)this->ptr;
  step = this->elementCount;
  structDataSize = this->step;
  SVar3 = this->structDataSize;
  SVar2 = this->structPointerCount;
  EVar1 = this->elementSize;
  this_00 = __return_storage_ptr__;
  iVar4 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  ptr.key.parts.ptr._4_4_ = in_stack_ffffffffffffff8c;
  ptr.key.parts.ptr._0_4_ = SVar3;
  ptr.key.parts.size_._0_2_ = SVar2;
  ptr.key.parts.size_._2_2_ = 0;
  ptr.key.parts.size_._4_4_ = in_stack_ffffffffffffff94;
  ptr.key.parts.disposer._0_1_ = EVar1;
  ptr.key.parts.disposer._1_3_ = 0;
  ptr.key.parts.disposer._4_4_ = in_stack_ffffffffffffff9c;
  ptr.value.dir.disposer._0_4_ = iVar4;
  ptr.value.dir._4_12_ = in_stack_ffffffffffffffa4;
  ptr.value._16_8_ = this_00;
  ListReader::ListReader
            (this_00,&segment->super_SegmentReader,capTable,ptr,elementCount,step,structDataSize,
             (StructPointerCount)segment,(ElementSize)capTable,elementCount);
  return __return_storage_ptr__;
}

Assistant:

ListReader ListBuilder::asReader() const {
  return ListReader(segment, capTable, ptr, elementCount, step, structDataSize, structPointerCount,
                    elementSize, kj::maxValue);
}